

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selectLinkLayer.cpp
# Opt level: O3

EC_T_DWORD
CreateLinkParmsFromCmdLineRTL8169
          (EC_T_CHAR **ptcWord,EC_T_CHAR **lpCmdLine,EC_T_CHAR *tcStorage,EC_T_BOOL *pbGetNextWord,
          EC_T_LINK_PARMS **ppLinkParms)

{
  uint uVar1;
  EC_T_DWORD EVar2;
  EC_T_BOOL EVar3;
  undefined8 *__ptr;
  EC_T_DWORD *pdwValue;
  EC_T_CHAR *tcStorage_00;
  EC_T_CHAR *tcStorage_01;
  EC_T_CHAR **lpCmdLine_00;
  
  uVar1 = strcasecmp(*ptcWord,"-rtl8169");
  pdwValue = (EC_T_DWORD *)(ulong)uVar1;
  EVar2 = 0x9811000c;
  if (uVar1 == 0) {
    __ptr = (undefined8 *)calloc(1,0x48);
    if (__ptr == (undefined8 *)0x0) {
      EVar2 = 0x9811000a;
    }
    else {
      *__ptr = 0x48ba12ca52;
      *(char (*) [8])(__ptr + 1) = (char  [8])0x393631384c5452;
      __ptr[2] = 0;
      __ptr[3] = 0;
      __ptr[4] = 0;
      *(undefined8 *)((long)__ptr + 0x27) = 0;
      lpCmdLine_00 = (EC_T_CHAR **)(__ptr + 6);
      __ptr[6] = 0x200000001;
      EVar3 = ParseDword(ptcWord,lpCmdLine_00,tcStorage_00,pdwValue);
      if ((EVar3 != 0) &&
         (EVar3 = ParseLinkMode(ptcWord,lpCmdLine_00,tcStorage_01,
                                (EC_T_LINKMODE *)((long)__ptr + 0x34)), EVar3 != 0)) {
        *(undefined4 *)(__ptr + 8) = 0;
        *(undefined8 **)pbGetNextWord = __ptr;
        return 0;
      }
      free(__ptr);
      EVar2 = 0x9811000b;
    }
  }
  return EVar2;
}

Assistant:

static EC_T_DWORD CreateLinkParmsFromCmdLineRTL8169(EC_T_CHAR** ptcWord, EC_T_CHAR** lpCmdLine, EC_T_CHAR* tcStorage, EC_T_BOOL*  pbGetNextWord,
                                                    EC_T_LINK_PARMS** ppLinkParms)
{
EC_T_DWORD dwRetVal = EC_E_ERROR;
EC_T_LINK_PARMS_RTL8169* pLinkParmsAdapter = EC_NULL;

    EC_UNREFPARM(pbGetNextWord);

    /* check for matching adapter */
    if (OsStricmp((*ptcWord), "-rtl8169") != 0)
    {
        dwRetVal = EC_E_NOTFOUND;
        goto Exit;
    }
    /* alloc adapter specific link parms */
    pLinkParmsAdapter = (EC_T_LINK_PARMS_RTL8169*)OsMalloc(sizeof(EC_T_LINK_PARMS_RTL8169));
    if (EC_NULL == pLinkParmsAdapter)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }
    OsMemset(pLinkParmsAdapter, 0, sizeof(EC_T_LINK_PARMS_RTL8169));
    LinkParmsInit(&pLinkParmsAdapter->linkParms, EC_LINK_PARMS_SIGNATURE_RTL8169, sizeof(EC_T_LINK_PARMS_RTL8169), EC_LINK_PARMS_IDENT_RTL8169, 1, EcLinkMode_POLLING);

    if (!ParseDword(ptcWord, lpCmdLine, tcStorage, &pLinkParmsAdapter->linkParms.dwInstance)
       || !ParseLinkMode(ptcWord, lpCmdLine, tcStorage, &pLinkParmsAdapter->linkParms.eLinkMode))
    {
        dwRetVal = EC_E_INVALIDPARM;
        goto Exit;
    }

    pLinkParmsAdapter->bNotUseDmaBuffers = EC_FALSE;
#if (defined _ARM_) || (defined __arm__)
    /* for arm platform we should not use DMA memory because any unaligned access creates crash */
    pLinkParmsAdapter->bNotUseDmaBuffers = EC_TRUE;
#endif

    /* no errors */
    *ppLinkParms = &pLinkParmsAdapter->linkParms;
    dwRetVal = EC_E_NOERROR;

Exit:
    if (EC_E_NOERROR != dwRetVal)
    {
        SafeOsFree(pLinkParmsAdapter);
    }
    return dwRetVal;
}